

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MurmurHash3.cpp
# Opt level: O2

void MurmurHash3_x86_32(void *key,int len,uint32_t seed,void *out)

{
  uint uVar1;
  long lVar2;
  byte *pbVar3;
  uint uVar4;
  uint8_t *data;
  
  pbVar3 = (byte *)((long)((len / 4) * 4) + (long)key);
  for (lVar2 = (long)-(len / 4); lVar2 != 0; lVar2 = lVar2 + 1) {
    uVar4 = ((uint)(*(int *)(pbVar3 + lVar2 * 4) * -0x3361d2af) >> 0x11 |
            *(int *)(pbVar3 + lVar2 * 4) * 0x16a88000) * 0x1b873593 ^ seed;
    seed = (uVar4 >> 0x13 | uVar4 << 0xd) * 5 + 0xe6546b64;
  }
  uVar1 = 0;
  uVar4 = 0;
  switch(len & 3) {
  case 3:
    uVar4 = (uint)pbVar3[2] << 0x10;
  case 2:
    uVar1 = uVar4 | (uint)pbVar3[1] << 8;
  case 1:
    seed = seed ^ ((*pbVar3 ^ uVar1) * -0x3361d2af >> 0x11 | (*pbVar3 ^ uVar1) * 0x16a88000) *
                  0x1b873593;
  case 0:
    uVar4 = ((seed ^ len) >> 0x10 ^ seed ^ len) * -0x7a143595;
    uVar4 = (uVar4 >> 0xd ^ uVar4) * -0x3d4d51cb;
    *(uint *)out = uVar4 >> 0x10 ^ uVar4;
    return;
  }
}

Assistant:

void MurmurHash3_x86_32 ( const void * key, int len,
                          uint32_t seed, void * out )
{
  const uint8_t * data = (const uint8_t*)key;
  const int nblocks = len / 4;

  uint32_t h1 = seed;

  const uint32_t c1 = 0xcc9e2d51;
  const uint32_t c2 = 0x1b873593;

  //----------
  // body

  const uint32_t * blocks = (const uint32_t *)(data + nblocks*4);

  for(int i = -nblocks; i; i++)
  {
    uint32_t k1 = getblock32(blocks,i);

    k1 *= c1;
    k1 = ROTL32(k1,15);
    k1 *= c2;
    
    h1 ^= k1;
    h1 = ROTL32(h1,13); 
    h1 = h1*5+0xe6546b64;
  }

  //----------
  // tail

  const uint8_t * tail = (const uint8_t*)(data + nblocks*4);

  uint32_t k1 = 0;

  switch(len & 3)
  {
  case 3: k1 ^= tail[2] << 16;
  case 2: k1 ^= tail[1] << 8;
  case 1: k1 ^= tail[0];
          k1 *= c1; k1 = ROTL32(k1,15); k1 *= c2; h1 ^= k1;
  };

  //----------
  // finalization

  h1 ^= len;

  h1 = fmix32(h1);

  *(uint32_t*)out = h1;
}